

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrfac.c
# Opt level: O0

void qrfac(int m,int n,double *a,int lda,int pivot,int *ipvt,int lipvt,double *rdiag,double *acnorm,
          double *wa)

{
  double *pdVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  int in_ECX;
  long lVar4;
  long in_RDX;
  int in_ESI;
  int in_EDI;
  int in_R8D;
  long in_R9;
  double dVar5;
  double dVar6;
  long in_stack_00000010;
  int kmax;
  double ajnorm;
  double epsmch;
  int minmn;
  double temp;
  double sum;
  int jp1;
  int k;
  int j;
  int i;
  double d1;
  double local_70;
  int local_68;
  int local_64;
  double local_60;
  double local_40;
  int local_34;
  int local_30;
  int local_2c;
  
  dVar5 = dpmpar(1);
  for (local_30 = 0; local_30 < in_ESI; local_30 = local_30 + 1) {
    dVar6 = enorm((int)((ulong)in_RDX >> 0x20),(double *)CONCAT44(in_ECX,in_R8D));
    *(double *)((long)ajnorm + (long)local_30 * 8) = dVar6;
    *(undefined8 *)(in_stack_00000010 + (long)local_30 * 8) =
         *(undefined8 *)((long)ajnorm + (long)local_30 * 8);
    *(undefined8 *)((long)epsmch + (long)local_30 * 8) =
         *(undefined8 *)(in_stack_00000010 + (long)local_30 * 8);
    if (in_R8D != 0) {
      *(int *)(in_R9 + (long)local_30 * 4) = local_30 + 1;
    }
  }
  local_68 = in_ESI;
  if (in_EDI <= in_ESI) {
    local_68 = in_EDI;
  }
  for (local_30 = 0; local_30 < local_68; local_30 = local_30 + 1) {
    if (in_R8D != 0) {
      local_64 = local_30;
      for (local_34 = local_30; local_34 < in_ESI; local_34 = local_34 + 1) {
        dVar6 = *(double *)(in_stack_00000010 + (long)local_34 * 8);
        pdVar1 = (double *)(in_stack_00000010 + (long)local_64 * 8);
        if (*pdVar1 <= dVar6 && dVar6 != *pdVar1) {
          local_64 = local_34;
        }
      }
      if (local_64 != local_30) {
        for (local_2c = 0; local_2c < in_EDI; local_2c = local_2c + 1) {
          uVar2 = *(undefined8 *)(in_RDX + (long)(local_2c + local_30 * in_ECX) * 8);
          *(undefined8 *)(in_RDX + (long)(local_2c + local_30 * in_ECX) * 8) =
               *(undefined8 *)(in_RDX + (long)(local_2c + local_64 * in_ECX) * 8);
          *(undefined8 *)(in_RDX + (long)(local_2c + local_64 * in_ECX) * 8) = uVar2;
        }
        *(undefined8 *)(in_stack_00000010 + (long)local_64 * 8) =
             *(undefined8 *)(in_stack_00000010 + (long)local_30 * 8);
        *(undefined8 *)((long)epsmch + (long)local_64 * 8) =
             *(undefined8 *)((long)epsmch + (long)local_30 * 8);
        uVar3 = *(undefined4 *)(in_R9 + (long)local_30 * 4);
        *(undefined4 *)(in_R9 + (long)local_30 * 4) = *(undefined4 *)(in_R9 + (long)local_64 * 4);
        *(undefined4 *)(in_R9 + (long)local_64 * 4) = uVar3;
      }
    }
    local_60 = enorm((int)((ulong)in_RDX >> 0x20),(double *)CONCAT44(in_ECX,in_R8D));
    if ((local_60 != 0.0) || (NAN(local_60))) {
      pdVar1 = (double *)(in_RDX + (long)(local_30 + local_30 * in_ECX) * 8);
      if (*pdVar1 <= 0.0 && *pdVar1 != 0.0) {
        local_60 = -local_60;
      }
      for (local_2c = local_30; local_2c < in_EDI; local_2c = local_2c + 1) {
        lVar4 = (long)(local_2c + local_30 * in_ECX);
        *(double *)(in_RDX + lVar4 * 8) = *(double *)(in_RDX + lVar4 * 8) / local_60;
      }
      lVar4 = (long)(local_30 + local_30 * in_ECX);
      *(double *)(in_RDX + lVar4 * 8) = *(double *)(in_RDX + lVar4 * 8) + 1.0;
      local_34 = local_30 + 1;
      if (local_34 < in_ESI) {
        for (; local_34 < in_ESI; local_34 = local_34 + 1) {
          local_40 = 0.0;
          for (local_2c = local_30; local_2c < in_EDI; local_2c = local_2c + 1) {
            local_40 = *(double *)(in_RDX + (long)(local_2c + local_30 * in_ECX) * 8) *
                       *(double *)(in_RDX + (long)(local_2c + local_34 * in_ECX) * 8) + local_40;
          }
          dVar6 = *(double *)(in_RDX + (long)(local_30 + local_30 * in_ECX) * 8);
          for (local_2c = local_30; local_2c < in_EDI; local_2c = local_2c + 1) {
            lVar4 = (long)(local_2c + local_34 * in_ECX);
            *(double *)(in_RDX + lVar4 * 8) =
                 -(local_40 / dVar6) *
                 *(double *)(in_RDX + (long)(local_2c + local_30 * in_ECX) * 8) +
                 *(double *)(in_RDX + lVar4 * 8);
          }
          if ((in_R8D != 0) &&
             ((dVar6 = *(double *)(in_stack_00000010 + (long)local_34 * 8), dVar6 != 0.0 ||
              (NAN(dVar6))))) {
            dVar6 = *(double *)(in_RDX + (long)(local_30 + local_34 * in_ECX) * 8) /
                    *(double *)(in_stack_00000010 + (long)local_34 * 8);
            local_70 = -dVar6 * dVar6 + 1.0;
            if (local_70 <= 0.0) {
              local_70 = 0.0;
            }
            dVar6 = sqrt(local_70);
            *(double *)(in_stack_00000010 + (long)local_34 * 8) =
                 dVar6 * *(double *)(in_stack_00000010 + (long)local_34 * 8);
            dVar6 = *(double *)(in_stack_00000010 + (long)local_34 * 8) /
                    *(double *)((long)epsmch + (long)local_34 * 8);
            if (dVar6 * dVar6 * 0.05 <= dVar5) {
              dVar6 = enorm((int)((ulong)in_RDX >> 0x20),(double *)CONCAT44(in_ECX,in_R8D));
              *(double *)(in_stack_00000010 + (long)local_34 * 8) = dVar6;
              *(undefined8 *)((long)epsmch + (long)local_34 * 8) =
                   *(undefined8 *)(in_stack_00000010 + (long)local_34 * 8);
            }
          }
        }
      }
    }
    *(double *)(in_stack_00000010 + (long)local_30 * 8) = -local_60;
  }
  return;
}

Assistant:

__cminpack_attr__
void __cminpack_func__(qrfac)(int m, int n, real *a, int
	lda, int pivot, int *ipvt, int lipvt, real *rdiag,
	 real *acnorm, real *wa)
{
#ifdef USE_LAPACK
    __CLPK_integer m_ = m;
    __CLPK_integer n_ = n;
    __CLPK_integer lda_ = lda;
    __CLPK_integer *jpvt;

    int i, j, k;
    real t;
    real* tau = wa;
    const __CLPK_integer ltau = m > n ? n : m;
    __CLPK_integer lwork = -1;
    __CLPK_integer info = 0;
    real* work;

    if (pivot) {
        assert( lipvt >= n );
        if (sizeof(__CLPK_integer) != sizeof(ipvt[0])) {
            jpvt = malloc(n*sizeof(__CLPK_integer));
        } else {
            /* __CLPK_integer is actually an int, just do a cast */
            jpvt = (__CLPK_integer *)ipvt;
        }
        /* set all columns free */
        memset(jpvt, 0, sizeof(int)*n);
    }
    
    /* query optimal size of work */
    lwork = -1;
    if (pivot) {
        __cminpack_lapack__(geqp3_)(&m_,&n_,a,&lda_,jpvt,tau,tau,&lwork,&info);
        lwork = (int)tau[0];
        assert( lwork >= 3*n+1  );
    } else {
        __cminpack_lapack__(geqrf_)(&m_,&n_,a,&lda_,tau,tau,&lwork,&info);
        lwork = (int)tau[0];
        assert( lwork >= 1 && lwork >= n );
    }
    
    assert( info == 0 );
    
    /* alloc work area */
    work = (real *)malloc(sizeof(real)*lwork);
    assert(work != NULL);
    
    /* set acnorm first (from the doc of qrfac, acnorm may point to the same area as rdiag) */
    if (acnorm != rdiag) {
        for (j = 0; j < n; ++j) {
            acnorm[j] = __cminpack_func__(enorm)(m, &a[j * lda]);
        }
    }
    
    /* QR decomposition */
    if (pivot) {
        __cminpack_lapack__(geqp3_)(&m_,&n_,a,&lda_,jpvt,tau,work,&lwork,&info);
    } else {
        __cminpack_lapack__(geqrf_)(&m_,&n_,a,&lda_,tau,work,&lwork,&info);
    }
    assert(info == 0);
    
    /* set rdiag, before the diagonal is replaced */
    memset(rdiag, 0, sizeof(real)*n);
    for(i=0 ; i<n ; ++i) {
        rdiag[i] = a[i*lda+i];
    }
    
    /* modify lower trinagular part to look like qrfac's output */
    for(i=0 ; i<ltau ; ++i) {
        k = i*lda+i;
        t = tau[i];
        a[k] = t;
        for(j=i+1 ; j<m ; j++) {
            k++;
            a[k] *= t;
        }
    }
    
    free(work);
    if (pivot) {
        /* convert back jpvt to ipvt */
        if (sizeof(__CLPK_integer) != sizeof(ipvt[0])) {
            for(i=0; i<n; ++i) {
                ipvt[i] = jpvt[i];
            }
            free(jpvt);
        }
    }
#else /* !USE_LAPACK */
    /* Initialized data */

#define p05 .05

    /* System generated locals */
    real d1;

    /* Local variables */
    int i, j, k, jp1;
    real sum;
    real temp;
    int minmn;
    real epsmch;
    real ajnorm;

/*     ********** */

/*     subroutine qrfac */

/*     this subroutine uses householder transformations with column */
/*     pivoting (optional) to compute a qr factorization of the */
/*     m by n matrix a. that is, qrfac determines an orthogonal */
/*     matrix q, a permutation matrix p, and an upper trapezoidal */
/*     matrix r with diagonal elements of nonincreasing magnitude, */
/*     such that a*p = q*r. the householder transformation for */
/*     column k, k = 1,2,...,min(m,n), is of the form */

/*                           t */
/*           i - (1/u(k))*u*u */

/*     where u has zeros in the first k-1 positions. the form of */
/*     this transformation and the method of pivoting first */
/*     appeared in the corresponding linpack subroutine. */

/*     the subroutine statement is */

/*       subroutine qrfac(m,n,a,lda,pivot,ipvt,lipvt,rdiag,acnorm,wa) */

/*     where */

/*       m is a positive integer input variable set to the number */
/*         of rows of a. */

/*       n is a positive integer input variable set to the number */
/*         of columns of a. */

/*       a is an m by n array. on input a contains the matrix for */
/*         which the qr factorization is to be computed. on output */
/*         the strict upper trapezoidal part of a contains the strict */
/*         upper trapezoidal part of r, and the lower trapezoidal */
/*         part of a contains a factored form of q (the non-trivial */
/*         elements of the u vectors described above). */

/*       lda is a positive integer input variable not less than m */
/*         which specifies the leading dimension of the array a. */

/*       pivot is a logical input variable. if pivot is set true, */
/*         then column pivoting is enforced. if pivot is set false, */
/*         then no column pivoting is done. */

/*       ipvt is an integer output array of length lipvt. ipvt */
/*         defines the permutation matrix p such that a*p = q*r. */
/*         column j of p is column ipvt(j) of the identity matrix. */
/*         if pivot is false, ipvt is not referenced. */

/*       lipvt is a positive integer input variable. if pivot is false, */
/*         then lipvt may be as small as 1. if pivot is true, then */
/*         lipvt must be at least n. */

/*       rdiag is an output array of length n which contains the */
/*         diagonal elements of r. */

/*       acnorm is an output array of length n which contains the */
/*         norms of the corresponding columns of the input matrix a. */
/*         if this information is not needed, then acnorm can coincide */
/*         with rdiag. */

/*       wa is a work array of length n. if pivot is false, then wa */
/*         can coincide with rdiag. */

/*     subprograms called */

/*       minpack-supplied ... dpmpar,enorm */

/*       fortran-supplied ... dmax1,dsqrt,min0 */

/*     argonne national laboratory. minpack project. march 1980. */
/*     burton s. garbow, kenneth e. hillstrom, jorge j. more */

/*     ********** */
    (void)lipvt;

/*     epsmch is the machine precision. */

    epsmch = __cminpack_func__(dpmpar)(1);

/*     compute the initial column norms and initialize several arrays. */

    for (j = 0; j < n; ++j) {
	acnorm[j] = __cminpack_func__(enorm)(m, &a[j * lda + 0]);
	rdiag[j] = acnorm[j];
	wa[j] = rdiag[j];
	if (pivot) {
	    ipvt[j] = j+1;
	}
    }

/*     reduce a to r with householder transformations. */

    minmn = min(m,n);
    for (j = 0; j < minmn; ++j) {
	if (pivot) {

/*        bring the column of largest norm into the pivot position. */

            int kmax = j;
            for (k = j; k < n; ++k) {
                if (rdiag[k] > rdiag[kmax]) {
                    kmax = k;
                }
            }
            if (kmax != j) {
                for (i = 0; i < m; ++i) {
                    temp = a[i + j * lda];
                    a[i + j * lda] = a[i + kmax * lda];
                    a[i + kmax * lda] = temp;
                }
                rdiag[kmax] = rdiag[j];
                wa[kmax] = wa[j];
                k = ipvt[j];
                ipvt[j] = ipvt[kmax];
                ipvt[kmax] = k;
            }
        }

/*        compute the householder transformation to reduce the */
/*        j-th column of a to a multiple of the j-th unit vector. */

	ajnorm = __cminpack_func__(enorm)(m - (j+1) + 1, &a[j + j * lda]);
	if (ajnorm != 0.) {
            if (a[j + j * lda] < 0.) {
                ajnorm = -ajnorm;
            }
            for (i = j; i < m; ++i) {
                a[i + j * lda] /= ajnorm;
            }
            a[j + j * lda] += 1;

/*        apply the transformation to the remaining columns */
/*        and update the norms. */

            jp1 = j + 1;
            if (n > jp1) {
                for (k = jp1; k < n; ++k) {
                    sum = 0.;
                    for (i = j; i < m; ++i) {
                        sum += a[i + j * lda] * a[i + k * lda];
                    }
                    temp = sum / a[j + j * lda];
                    for (i = j; i < m; ++i) {
                        a[i + k * lda] -= temp * a[i + j * lda];
                    }
                    if (pivot && rdiag[k] != 0.) {
                        temp = a[j + k * lda] / rdiag[k];
                        /* Computing MAX */
                        d1 = 1 - temp * temp;
                        rdiag[k] *= sqrt((max((real)0.,d1)));
                        /* Computing 2nd power */
                        d1 = rdiag[k] / wa[k];
                        if (p05 * (d1 * d1) <= epsmch) {
                            rdiag[k] = __cminpack_func__(enorm)(m - (j+1), &a[jp1 + k * lda]);
                            wa[k] = rdiag[k];
                        }
                    }
                }
            }
        }
	rdiag[j] = -ajnorm;
    }

/*     last card of subroutine qrfac. */
#endif /* !USE_LAPACK */
}